

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::LinearConstraint::LinearConstraint
          (LinearConstraint *this,size_t size,string *name)

{
  void *pvVar1;
  string *in_RDX;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  LinearConstraintImplementation *in_stack_ffffffffffffffd0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,in_RDX);
  Constraint::Constraint
            ((Constraint *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  *in_RDI = &PTR__LinearConstraint_003fb0a0;
  pvVar1 = operator_new(0x140);
  LinearConstraintImplementation::LinearConstraintImplementation
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  in_RDI[0x13] = pvVar1;
  return;
}

Assistant:

LinearConstraint::LinearConstraint(size_t size, const std::string name)
        : Constraint(size, name)
        , m_pimpl(new LinearConstraintImplementation(size))
        { }